

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

HashType __thiscall
cfd::core::DescriptorScriptReference::GetHashType(DescriptorScriptReference *this)

{
  bool bVar1;
  HashType HVar2;
  CfdException *this_00;
  Script *this_01;
  allocator local_39;
  undefined1 local_38 [32];
  
  this_01 = &this->locking_script_;
  bVar1 = Script::IsP2shScript(this_01);
  if (bVar1) {
    HVar2 = kP2sh;
  }
  else {
    bVar1 = Script::IsP2wpkhScript(this_01);
    if (bVar1) {
      HVar2 = kP2wpkh;
    }
    else {
      bVar1 = Script::IsP2wshScript(this_01);
      if (bVar1) {
        HVar2 = kP2wsh;
      }
      else {
        bVar1 = Script::IsTaprootScript(this_01);
        if (bVar1) {
          HVar2 = kTaproot;
        }
        else {
          bVar1 = Script::IsP2pkScript(this_01);
          HVar2 = kP2pkh;
          if (!bVar1) {
            local_38._0_8_ = "cfdcore_descriptor.cpp";
            local_38._8_4_ = 0x2f1;
            local_38._16_8_ = "GetHashType";
            logger::warn<>((CfdSourceLocation *)local_38,
                           "Failed to GetHashType. unsupported hash type.");
            this_00 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string((string *)local_38,"unsupported hash type.",&local_39);
            CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_38);
            __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
      }
    }
  }
  return HVar2;
}

Assistant:

HashType DescriptorScriptReference::GetHashType() const {
  if (locking_script_.IsP2shScript()) {
    return HashType::kP2sh;
  }
  if (locking_script_.IsP2wpkhScript()) {
    return HashType::kP2wpkh;
  }
  if (locking_script_.IsP2wshScript()) {
    return HashType::kP2wsh;
  }
  if (locking_script_.IsTaprootScript()) {
    return HashType::kTaproot;
  }
  if (locking_script_.IsP2pkScript()) {
    return HashType::kP2pkh;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetHashType. unsupported hash type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unsupported hash type.");
}